

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  bool bVar1;
  int iVar2;
  cmGlobalGenerator *pcVar3;
  string outputFileLocation;
  string command;
  string tmpOutputFile;
  string local_418;
  cmAlphaNum local_3f8;
  cmAlphaNum local_3c8;
  ostringstream emsg_1;
  ifstream ifs;
  
  (this->FindErrorMessage)._M_string_length = 0;
  *(this->FindErrorMessage)._M_dataplus._M_p = '\0';
  (this->OutputFile)._M_string_length = 0;
  *(this->OutputFile)._M_dataplus._M_p = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tmpOutputFile,"/",(allocator<char> *)&ifs);
  std::__cxx11::string::append((string *)&tmpOutputFile);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  iVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x26])(pcVar3);
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::append((char *)&tmpOutputFile);
  }
  std::__cxx11::string::append((char *)&tmpOutputFile);
  _ifs = (this->BinaryDirectory)._M_string_length;
  _emsg_1 = (pointer)tmpOutputFile._M_string_length;
  cmStrCat<>(&command,(cmAlphaNum *)&ifs,(cmAlphaNum *)&emsg_1);
  bVar1 = cmsys::SystemTools::FileExists(&command);
  if (bVar1) {
    outputFileLocation._M_dataplus._M_p = (pointer)&outputFileLocation.field_2;
    outputFileLocation._M_string_length = 0;
    outputFileLocation.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&ifs,command._M_dataplus._M_p,_S_in);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)&ifs,&outputFileLocation,(bool *)0x0,0xffffffffffffffff);
    bVar1 = cmsys::SystemTools::FileExists(&outputFileLocation);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath((string *)&emsg_1,&outputFileLocation);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&emsg_1);
      std::__cxx11::string::~string((string *)&emsg_1);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&emsg_1);
      std::operator<<((ostream *)&emsg_1,"Recorded try_compile output location doesn\'t exist:\n");
      local_3c8.View_._M_len = 2;
      local_3c8.View_._M_str = "  ";
      local_3f8.View_._M_len = outputFileLocation._M_string_length;
      local_3f8.View_._M_str = outputFileLocation._M_dataplus._M_p;
      cmStrCat<char[2]>(&local_418,&local_3c8,&local_3f8,(char (*) [2])0x64a205);
      std::operator<<((ostream *)&emsg_1,(string *)&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&emsg_1);
    }
    std::ifstream::~ifstream(&ifs);
    std::__cxx11::string::~string((string *)&outputFileLocation);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Unable to find the recorded try_compile output location:\n");
    _emsg_1 = (pointer)0x2;
    local_3c8.View_._M_len = command._M_string_length;
    local_3c8.View_._M_str = command._M_dataplus._M_p;
    cmStrCat<char[2]>((string *)&local_3f8,(cmAlphaNum *)&emsg_1,&local_3c8,(char (*) [2])0x64a205);
    std::operator<<((ostream *)&ifs,(string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&emsg_1);
    std::__cxx11::string::~string((string *)&emsg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  }
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)&tmpOutputFile);
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;

  if (this->Makefile->GetGlobalGenerator()->IsMultiConfig()) {
    tmpOutputFile += "_DEBUG";
  }
  tmpOutputFile += "_loc";

  std::string command = cmStrCat(this->BinaryDirectory, tmpOutputFile);
  if (!cmSystemTools::FileExists(command)) {
    std::ostringstream emsg;
    emsg << "Unable to find the recorded try_compile output location:\n";
    emsg << cmStrCat("  ", command, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  std::string outputFileLocation;
  cmsys::ifstream ifs(command.c_str());
  cmSystemTools::GetLineFromStream(ifs, outputFileLocation);
  if (!cmSystemTools::FileExists(outputFileLocation)) {
    std::ostringstream emsg;
    emsg << "Recorded try_compile output location doesn't exist:\n";
    emsg << cmStrCat("  ", outputFileLocation, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  this->OutputFile = cmSystemTools::CollapseFullPath(outputFileLocation);
}